

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_nego(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 arg2;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  arg2 = tcg_const_i64_ppc64(tcg_ctx,0);
  uVar1 = ctx->opcode;
  gen_op_arith_subf(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8)),
                    *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8)),arg2,false,false,
                    true,(_Bool)((byte)uVar1 & 1));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_nego(DisasContext *ctx)
{
    gen_op_arith_neg(ctx, 1);
}